

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

int conn_send_to(conn_handle *conn,uint8_t *buff,size_t buff_len,uint32_t addr,uint16_t port)

{
  void *pvVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  sockaddr local_40;
  
  iVar2 = -0x5b;
  if (conn->type == CONN_TYPE_UDP) {
    pvVar1 = conn->priv;
    local_40.sa_data[6] = '\0';
    local_40.sa_data[7] = '\0';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    local_40.sa_data[10] = '\0';
    local_40.sa_data[0xb] = '\0';
    local_40.sa_data[0xc] = '\0';
    local_40.sa_data[0xd] = '\0';
    local_40.sa_data._0_2_ = port << 8 | port >> 8;
    local_40.sa_family = 2;
    local_40.sa_data._2_4_ = addr;
    mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x90));
    if (*(int *)((long)pvVar1 + 8) == -1) {
      iVar2 = -0x6b;
    }
    else {
      iVar2 = 0;
      if (buff_len != 0) {
        do {
          sVar3 = sendto(*(int *)((long)pvVar1 + 8),buff,buff_len & 0xffffffff,0x4000,&local_40,0x10
                        );
          iVar2 = (int)sVar3;
          if (iVar2 == 0) {
            iVar2 = -0x20;
            break;
          }
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            iVar2 = -*piVar4;
            break;
          }
          buff_len = buff_len - (long)iVar2;
          iVar2 = 0;
        } while (buff_len != 0);
      }
    }
    mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  }
  return iVar2;
}

Assistant:

int conn_send_to(struct conn_handle *conn, const uint8_t *buff,
		 size_t buff_len, uint32_t addr, uint16_t port)
{
	struct conn_priv *priv = conn->priv;
	struct sockaddr_in saddr;
	int ret;

	if (conn->type != CONN_TYPE_UDP)
		return -EPROTOTYPE;

	memset(&saddr, 0x0, sizeof(saddr));

	saddr.sin_family = AF_INET;
	saddr.sin_port = htons(port);
	saddr.sin_addr.s_addr = addr;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd != INVALID_SOCKET) {
		while (buff_len > 0) {
			/*! @TODO Bug? buff isn't changed */
			ret = sendto(priv->fd, (const char *)buff,
				     (socklen_t)buff_len, MSG_NOSIGNAL,
				     (struct sockaddr *)&saddr,
				     sizeof(saddr));

			if (ret == 0) {
				ret = -EPIPE;

				goto conn_send_to_exit;
			} else if (ret == SOCKET_ERROR) {
				ret = SOCK_ERRNO;

#ifdef _WIN32
				if (ret == -WSAESHUTDOWN)
					ret = -EPIPE;

#endif
				goto conn_send_to_exit;
			}

			buff_len -= ret;
		}

		ret = 0;
	} else {
		ret = -ENOTCONN;
	}

conn_send_to_exit:
	mutex_unlock_shared(&priv->mutex);

	return ret;
}